

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool tdefl_compress_fast(tdefl_compressor *d)

{
  byte bVar1;
  ushort uVar2;
  mz_uint8 *pmVar3;
  mz_uint16 *pmVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  mz_uint8 *pmVar10;
  uint uVar11;
  bool bVar12;
  mz_uint local_ec;
  mz_uint local_e8;
  uint local_d8;
  mz_uint local_d0;
  uint local_cc;
  uint local_b4;
  ulong local_b0;
  bool local_a2;
  int n_2;
  mz_uint8 lit;
  int n_1;
  mz_uint32 s1;
  mz_uint32 s0;
  mz_uint32 probe_len;
  mz_uint16 *q;
  mz_uint16 *p;
  mz_uint probe_pos;
  mz_uint hash;
  mz_uint first_trigram;
  mz_uint8 *pCur_dict;
  mz_uint cur_match_len;
  mz_uint cur_match_dist;
  mz_uint32 n;
  mz_uint num_bytes_to_process;
  mz_uint dst_pos;
  mz_uint TDEFL_COMP_FAST_LOOKAHEAD_SIZE;
  mz_uint cur_pos;
  mz_uint8 *pLZ_flags;
  mz_uint8 *pLZ_code_buf;
  mz_uint local_28;
  mz_uint num_flags_left;
  mz_uint total_lz_bytes;
  mz_uint dict_size;
  mz_uint lookahead_size;
  mz_uint lookahead_pos;
  tdefl_compressor *d_local;
  
  dict_size = d->m_lookahead_pos;
  total_lz_bytes = d->m_lookahead_size;
  num_flags_left = d->m_dict_size;
  local_28 = d->m_total_lz_bytes;
  pLZ_code_buf._4_4_ = d->m_num_flags_left;
  pLZ_flags = d->m_pLZ_code_buf;
  _TDEFL_COMP_FAST_LOOKAHEAD_SIZE = d->m_pLZ_flags;
  dst_pos = dict_size & 0x7fff;
  while( true ) {
    local_a2 = true;
    if (d->m_src_buf_left == 0) {
      local_a2 = d->m_flush != TDEFL_NO_FLUSH && total_lz_bytes != 0;
    }
    if (!local_a2) break;
    uVar6 = dict_size + total_lz_bytes;
    if (d->m_src_buf_left < (ulong)(0x1000 - total_lz_bytes)) {
      local_b0 = d->m_src_buf_left;
    }
    else {
      local_b0 = (ulong)(0x1000 - total_lz_bytes);
    }
    cur_match_dist = (mz_uint)local_b0;
    d->m_src_buf_left = d->m_src_buf_left - (local_b0 & 0xffffffff);
    total_lz_bytes = cur_match_dist + total_lz_bytes;
    for (; n = uVar6 & 0x7fff, cur_match_dist != 0; cur_match_dist = cur_match_dist - local_b4) {
      if (0x8000 - n < cur_match_dist) {
        local_b4 = 0x8000 - n;
      }
      else {
        local_b4 = cur_match_dist;
      }
      memcpy(d->m_dict + n,d->m_pSrc,(ulong)local_b4);
      if (n < 0x101) {
        if (local_b4 < 0x101 - n) {
          local_cc = local_b4;
        }
        else {
          local_cc = 0x101 - n;
        }
        memcpy(d->m_dict + (ulong)n + 0x8000,d->m_pSrc,(ulong)local_cc);
      }
      d->m_pSrc = d->m_pSrc + local_b4;
      uVar6 = n + local_b4;
    }
    if (0x8000 - total_lz_bytes < num_flags_left) {
      local_d0 = 0x8000 - total_lz_bytes;
    }
    else {
      local_d0 = num_flags_left;
    }
    num_flags_left = local_d0;
    if ((d->m_flush == TDEFL_NO_FLUSH) && (total_lz_bytes < 0x1000)) break;
    while (3 < total_lz_bytes) {
      pCur_dict._4_4_ = 1;
      pmVar10 = d->m_dict + dst_pos;
      uVar6 = *(uint *)pmVar10;
      uVar7 = uVar6 & 0xffffff;
      uVar8 = (uVar7 ^ uVar7 >> 0x11) & 0xfff;
      uVar2 = d->m_hash[uVar8];
      d->m_hash[uVar8] = (mz_uint16)dict_size;
      uVar8 = dict_size - uVar2 & 0xffff;
      if ((num_flags_left < uVar8) ||
         (uVar11 = uVar2 & 0x7fff, (*(uint *)(d->m_dict + uVar11) & 0xffffff) != uVar7)) {
        *pLZ_flags = (mz_uint8)uVar7;
        *_TDEFL_COMP_FAST_LOOKAHEAD_SIZE = (byte)((int)(uint)*_TDEFL_COMP_FAST_LOOKAHEAD_SIZE >> 1);
        d->m_huff_count[0][uVar6 & 0xff] = d->m_huff_count[0][uVar6 & 0xff] + 1;
        pLZ_flags = pLZ_flags + 1;
      }
      else {
        _s0 = d->m_dict + uVar11;
        s1 = 0x20;
        q = (mz_uint16 *)pmVar10;
        do {
          bVar12 = false;
          pmVar3 = _s0 + 2;
          pmVar4 = q + 1;
          if (q[1] == *(mz_uint16 *)(_s0 + 2)) {
            bVar12 = false;
            pmVar3 = _s0 + 4;
            pmVar4 = q + 2;
            if (q[2] == *(mz_uint16 *)(_s0 + 4)) {
              bVar12 = false;
              pmVar3 = _s0 + 6;
              pmVar4 = q + 3;
              if (q[3] == *(mz_uint16 *)(_s0 + 6)) {
                bVar12 = false;
                pmVar3 = _s0 + 8;
                pmVar4 = q + 4;
                if (q[4] == *(mz_uint16 *)(_s0 + 8)) {
                  s1 = s1 - 1;
                  bVar12 = s1 != 0;
                }
              }
            }
          }
          q = pmVar4;
          _s0 = pmVar3;
        } while (bVar12);
        pCur_dict._4_4_ = (int)((long)q - (long)pmVar10 >> 1) * 2 + (uint)((mz_uint8)*q == *_s0);
        if ((s1 == 0) && (pCur_dict._4_4_ = 0, uVar8 != 0)) {
          pCur_dict._4_4_ = 0x102;
        }
        if ((pCur_dict._4_4_ < 3) || ((pCur_dict._4_4_ == 3 && (0x1fff < uVar8)))) {
          pCur_dict._4_4_ = 1;
          *pLZ_flags = (mz_uint8)uVar7;
          *_TDEFL_COMP_FAST_LOOKAHEAD_SIZE =
               (byte)((int)(uint)*_TDEFL_COMP_FAST_LOOKAHEAD_SIZE >> 1);
          d->m_huff_count[0][uVar6 & 0xff] = d->m_huff_count[0][uVar6 & 0xff] + 1;
          pLZ_flags = pLZ_flags + 1;
        }
        else {
          if (pCur_dict._4_4_ < total_lz_bytes) {
            local_d8 = pCur_dict._4_4_;
          }
          else {
            local_d8 = total_lz_bytes;
          }
          pCur_dict._4_4_ = local_d8;
          if (((local_d8 < 3) || (uVar8 == 0)) || (0x8000 < uVar8)) {
            __assert_fail("(cur_match_len >= TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 1) && (cur_match_dist <= TDEFL_LZ_DICT_SIZE)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                          ,0x5f2,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
          }
          uVar8 = uVar8 - 1;
          *pLZ_flags = (char)local_d8 + 0xfd;
          *(short *)(pLZ_flags + 1) = (short)uVar8;
          pLZ_flags = pLZ_flags + 3;
          *_TDEFL_COMP_FAST_LOOKAHEAD_SIZE =
               (byte)((int)(uint)*_TDEFL_COMP_FAST_LOOKAHEAD_SIZE >> 1) | 0x80;
          bVar1 = ""[uVar8 >> 8];
          if (uVar8 < 0x200) {
            bVar1 = ""[uVar8 & 0x1ff];
          }
          d->m_huff_count[1][bVar1] = d->m_huff_count[1][bVar1] + 1;
          d->m_huff_count[0][s_tdefl_len_sym[local_d8 - 3]] =
               d->m_huff_count[0][s_tdefl_len_sym[local_d8 - 3]] + 1;
        }
      }
      pLZ_code_buf._4_4_ = pLZ_code_buf._4_4_ - 1;
      if (pLZ_code_buf._4_4_ == 0) {
        pLZ_code_buf._4_4_ = 8;
        _TDEFL_COMP_FAST_LOOKAHEAD_SIZE = pLZ_flags;
        pLZ_flags = pLZ_flags + 1;
      }
      local_28 = pCur_dict._4_4_ + local_28;
      dict_size = pCur_dict._4_4_ + dict_size;
      if (num_flags_left + pCur_dict._4_4_ < 0x8000) {
        local_e8 = num_flags_left + pCur_dict._4_4_;
      }
      else {
        local_e8 = 0x8000;
      }
      num_flags_left = local_e8;
      dst_pos = dst_pos + pCur_dict._4_4_ & 0x7fff;
      if (total_lz_bytes < pCur_dict._4_4_) {
        __assert_fail("lookahead_size >= cur_match_len",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/miniz/miniz.c"
                      ,0x613,"mz_bool tdefl_compress_fast(tdefl_compressor *)");
      }
      total_lz_bytes = total_lz_bytes - pCur_dict._4_4_;
      if (d->m_lz_code_buf + 0xfff8 < pLZ_flags) {
        d->m_lookahead_pos = dict_size;
        d->m_lookahead_size = total_lz_bytes;
        d->m_dict_size = local_e8;
        d->m_total_lz_bytes = local_28;
        d->m_pLZ_code_buf = pLZ_flags;
        d->m_pLZ_flags = _TDEFL_COMP_FAST_LOOKAHEAD_SIZE;
        d->m_num_flags_left = pLZ_code_buf._4_4_;
        iVar9 = tdefl_flush_block(d,0);
        if (iVar9 != 0) {
          return (uint)(-1 < iVar9);
        }
        local_28 = d->m_total_lz_bytes;
        pLZ_flags = d->m_pLZ_code_buf;
        _TDEFL_COMP_FAST_LOOKAHEAD_SIZE = d->m_pLZ_flags;
        pLZ_code_buf._4_4_ = d->m_num_flags_left;
      }
    }
    while (total_lz_bytes != 0) {
      bVar1 = d->m_dict[dst_pos];
      local_28 = local_28 + 1;
      *pLZ_flags = bVar1;
      *_TDEFL_COMP_FAST_LOOKAHEAD_SIZE = (byte)((int)(uint)*_TDEFL_COMP_FAST_LOOKAHEAD_SIZE >> 1);
      pLZ_code_buf._4_4_ = pLZ_code_buf._4_4_ - 1;
      pbVar5 = pLZ_flags + 1;
      if (pLZ_code_buf._4_4_ == 0) {
        pLZ_code_buf._4_4_ = 8;
        _TDEFL_COMP_FAST_LOOKAHEAD_SIZE = pLZ_flags + 1;
        pbVar5 = pLZ_flags + 2;
      }
      pLZ_flags = pbVar5;
      d->m_huff_count[0][bVar1] = d->m_huff_count[0][bVar1] + 1;
      dict_size = dict_size + 1;
      if (num_flags_left + 1 < 0x8000) {
        local_ec = num_flags_left + 1;
      }
      else {
        local_ec = 0x8000;
      }
      num_flags_left = local_ec;
      dst_pos = dst_pos + 1 & 0x7fff;
      total_lz_bytes = total_lz_bytes - 1;
      if (d->m_lz_code_buf + 0xfff8 < pLZ_flags) {
        d->m_lookahead_pos = dict_size;
        d->m_lookahead_size = total_lz_bytes;
        d->m_dict_size = local_ec;
        d->m_total_lz_bytes = local_28;
        d->m_pLZ_code_buf = pLZ_flags;
        d->m_pLZ_flags = _TDEFL_COMP_FAST_LOOKAHEAD_SIZE;
        d->m_num_flags_left = pLZ_code_buf._4_4_;
        iVar9 = tdefl_flush_block(d,0);
        if (iVar9 != 0) {
          return (uint)(-1 < iVar9);
        }
        local_28 = d->m_total_lz_bytes;
        pLZ_flags = d->m_pLZ_code_buf;
        _TDEFL_COMP_FAST_LOOKAHEAD_SIZE = d->m_pLZ_flags;
        pLZ_code_buf._4_4_ = d->m_num_flags_left;
      }
    }
  }
  d->m_lookahead_pos = dict_size;
  d->m_lookahead_size = total_lz_bytes;
  d->m_dict_size = num_flags_left;
  d->m_total_lz_bytes = local_28;
  d->m_pLZ_code_buf = pLZ_flags;
  d->m_pLZ_flags = _TDEFL_COMP_FAST_LOOKAHEAD_SIZE;
  d->m_num_flags_left = pLZ_code_buf._4_4_;
  return 1;
}

Assistant:

static mz_bool tdefl_compress_fast(tdefl_compressor *d)
{
    /* Faster, minimally featured LZRW1-style match+parse loop with better register utilization. Intended for applications where raw throughput is valued more highly than ratio. */
    mz_uint lookahead_pos = d->m_lookahead_pos, lookahead_size = d->m_lookahead_size, dict_size = d->m_dict_size, total_lz_bytes = d->m_total_lz_bytes, num_flags_left = d->m_num_flags_left;
    mz_uint8 *pLZ_code_buf = d->m_pLZ_code_buf, *pLZ_flags = d->m_pLZ_flags;
    mz_uint cur_pos = lookahead_pos & TDEFL_LZ_DICT_SIZE_MASK;

    while ((d->m_src_buf_left) || ((d->m_flush) && (lookahead_size)))
    {
        const mz_uint TDEFL_COMP_FAST_LOOKAHEAD_SIZE = 4096;
        mz_uint dst_pos = (lookahead_pos + lookahead_size) & TDEFL_LZ_DICT_SIZE_MASK;
        mz_uint num_bytes_to_process = (mz_uint)MZ_MIN(d->m_src_buf_left, TDEFL_COMP_FAST_LOOKAHEAD_SIZE - lookahead_size);
        d->m_src_buf_left -= num_bytes_to_process;
        lookahead_size += num_bytes_to_process;

        while (num_bytes_to_process)
        {
            mz_uint32 n = MZ_MIN(TDEFL_LZ_DICT_SIZE - dst_pos, num_bytes_to_process);
            memcpy(d->m_dict + dst_pos, d->m_pSrc, n);
            if (dst_pos < (TDEFL_MAX_MATCH_LEN - 1))
                memcpy(d->m_dict + TDEFL_LZ_DICT_SIZE + dst_pos, d->m_pSrc, MZ_MIN(n, (TDEFL_MAX_MATCH_LEN - 1) - dst_pos));
            d->m_pSrc += n;
            dst_pos = (dst_pos + n) & TDEFL_LZ_DICT_SIZE_MASK;
            num_bytes_to_process -= n;
        }

        dict_size = MZ_MIN(TDEFL_LZ_DICT_SIZE - lookahead_size, dict_size);
        if ((!d->m_flush) && (lookahead_size < TDEFL_COMP_FAST_LOOKAHEAD_SIZE))
            break;

        while (lookahead_size >= 4)
        {
            mz_uint cur_match_dist, cur_match_len = 1;
            mz_uint8 *pCur_dict = d->m_dict + cur_pos;
            mz_uint first_trigram = (*(const mz_uint32 *)pCur_dict) & 0xFFFFFF;
            mz_uint hash = (first_trigram ^ (first_trigram >> (24 - (TDEFL_LZ_HASH_BITS - 8)))) & TDEFL_LEVEL1_HASH_SIZE_MASK;
            mz_uint probe_pos = d->m_hash[hash];
            d->m_hash[hash] = (mz_uint16)lookahead_pos;

            if (((cur_match_dist = (mz_uint16)(lookahead_pos - probe_pos)) <= dict_size) && ((*(const mz_uint32 *)(d->m_dict + (probe_pos &= TDEFL_LZ_DICT_SIZE_MASK)) & 0xFFFFFF) == first_trigram))
            {
                const mz_uint16 *p = (const mz_uint16 *)pCur_dict;
                const mz_uint16 *q = (const mz_uint16 *)(d->m_dict + probe_pos);
                mz_uint32 probe_len = 32;
                do
                {
                } while ((TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) &&
                         (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (TDEFL_READ_UNALIGNED_WORD2(++p) == TDEFL_READ_UNALIGNED_WORD2(++q)) && (--probe_len > 0));
                cur_match_len = ((mz_uint)(p - (const mz_uint16 *)pCur_dict) * 2) + (mz_uint)(*(const mz_uint8 *)p == *(const mz_uint8 *)q);
                if (!probe_len)
                    cur_match_len = cur_match_dist ? TDEFL_MAX_MATCH_LEN : 0;

                if ((cur_match_len < TDEFL_MIN_MATCH_LEN) || ((cur_match_len == TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 8U * 1024U)))
                {
                    cur_match_len = 1;
                    *pLZ_code_buf++ = (mz_uint8)first_trigram;
                    *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
                    d->m_huff_count[0][(mz_uint8)first_trigram]++;
                }
                else
                {
                    mz_uint32 s0, s1;
                    cur_match_len = MZ_MIN(cur_match_len, lookahead_size);

                    MZ_ASSERT((cur_match_len >= TDEFL_MIN_MATCH_LEN) && (cur_match_dist >= 1) && (cur_match_dist <= TDEFL_LZ_DICT_SIZE));

                    cur_match_dist--;

                    pLZ_code_buf[0] = (mz_uint8)(cur_match_len - TDEFL_MIN_MATCH_LEN);
                    *(mz_uint16 *)(&pLZ_code_buf[1]) = (mz_uint16)cur_match_dist;
                    pLZ_code_buf += 3;
                    *pLZ_flags = (mz_uint8)((*pLZ_flags >> 1) | 0x80);

                    s0 = s_tdefl_small_dist_sym[cur_match_dist & 511];
                    s1 = s_tdefl_large_dist_sym[cur_match_dist >> 8];
                    d->m_huff_count[1][(cur_match_dist < 512) ? s0 : s1]++;

                    d->m_huff_count[0][s_tdefl_len_sym[cur_match_len - TDEFL_MIN_MATCH_LEN]]++;
                }
            }
            else
            {
                *pLZ_code_buf++ = (mz_uint8)first_trigram;
                *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
                d->m_huff_count[0][(mz_uint8)first_trigram]++;
            }

            if (--num_flags_left == 0)
            {
                num_flags_left = 8;
                pLZ_flags = pLZ_code_buf++;
            }

            total_lz_bytes += cur_match_len;
            lookahead_pos += cur_match_len;
            dict_size = MZ_MIN(dict_size + cur_match_len, (mz_uint)TDEFL_LZ_DICT_SIZE);
            cur_pos = (cur_pos + cur_match_len) & TDEFL_LZ_DICT_SIZE_MASK;
            MZ_ASSERT(lookahead_size >= cur_match_len);
            lookahead_size -= cur_match_len;

            if (pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8])
            {
                int n;
                d->m_lookahead_pos = lookahead_pos;
                d->m_lookahead_size = lookahead_size;
                d->m_dict_size = dict_size;
                d->m_total_lz_bytes = total_lz_bytes;
                d->m_pLZ_code_buf = pLZ_code_buf;
                d->m_pLZ_flags = pLZ_flags;
                d->m_num_flags_left = num_flags_left;
                if ((n = tdefl_flush_block(d, 0)) != 0)
                    return (n < 0) ? MZ_FALSE : MZ_TRUE;
                total_lz_bytes = d->m_total_lz_bytes;
                pLZ_code_buf = d->m_pLZ_code_buf;
                pLZ_flags = d->m_pLZ_flags;
                num_flags_left = d->m_num_flags_left;
            }
        }

        while (lookahead_size)
        {
            mz_uint8 lit = d->m_dict[cur_pos];

            total_lz_bytes++;
            *pLZ_code_buf++ = lit;
            *pLZ_flags = (mz_uint8)(*pLZ_flags >> 1);
            if (--num_flags_left == 0)
            {
                num_flags_left = 8;
                pLZ_flags = pLZ_code_buf++;
            }

            d->m_huff_count[0][lit]++;

            lookahead_pos++;
            dict_size = MZ_MIN(dict_size + 1, (mz_uint)TDEFL_LZ_DICT_SIZE);
            cur_pos = (cur_pos + 1) & TDEFL_LZ_DICT_SIZE_MASK;
            lookahead_size--;

            if (pLZ_code_buf > &d->m_lz_code_buf[TDEFL_LZ_CODE_BUF_SIZE - 8])
            {
                int n;
                d->m_lookahead_pos = lookahead_pos;
                d->m_lookahead_size = lookahead_size;
                d->m_dict_size = dict_size;
                d->m_total_lz_bytes = total_lz_bytes;
                d->m_pLZ_code_buf = pLZ_code_buf;
                d->m_pLZ_flags = pLZ_flags;
                d->m_num_flags_left = num_flags_left;
                if ((n = tdefl_flush_block(d, 0)) != 0)
                    return (n < 0) ? MZ_FALSE : MZ_TRUE;
                total_lz_bytes = d->m_total_lz_bytes;
                pLZ_code_buf = d->m_pLZ_code_buf;
                pLZ_flags = d->m_pLZ_flags;
                num_flags_left = d->m_num_flags_left;
            }
        }
    }

    d->m_lookahead_pos = lookahead_pos;
    d->m_lookahead_size = lookahead_size;
    d->m_dict_size = dict_size;
    d->m_total_lz_bytes = total_lz_bytes;
    d->m_pLZ_code_buf = pLZ_code_buf;
    d->m_pLZ_flags = pLZ_flags;
    d->m_num_flags_left = num_flags_left;
    return MZ_TRUE;
}